

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_1::validateSortedAtomicRampAdditionValueChain
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *valueChain,deUint32 sumValue,
               int *invalidOperationNdx,deUint32 *errorDelta,deUint32 *errorExpected)

{
  pointer puVar1;
  long lVar2;
  pointer puVar3;
  ulong uVar4;
  uint uVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  int iVar8;
  ulong uVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainDelta;
  allocator_type local_49;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,
             (long)(valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2,&local_49);
  puVar3 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(valueChain->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 2);
  if (0 < (int)uVar5) {
    uVar9 = (ulong)(uVar5 & 0x7fffffff);
    uVar4 = 0;
    do {
      dVar7 = sumValue;
      if (uVar9 - 1 != uVar4) {
        dVar7 = puVar1[uVar4 + 1];
      }
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = dVar7 - puVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar9 != uVar4);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar4 = (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar3,local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  uVar9 = (ulong)((long)(valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                       ._M_impl.super__Vector_impl_data._M_start) >> 2;
  iVar8 = (int)uVar9;
  uVar4 = 0;
  dVar7 = 0;
  if (0 < iVar8) {
    uVar4 = uVar9 & 0xffffffff;
    dVar7 = 0;
  }
  do {
    dVar6 = dVar7;
    if ((deUint32)uVar4 == dVar6) goto LAB_014f47db;
    dVar7 = dVar6 + 1;
  } while (dVar7 == local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[(int)dVar6]);
  *invalidOperationNdx = dVar6;
  *errorDelta = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)dVar6];
  *errorExpected = dVar7;
LAB_014f47db:
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar8 <= (int)dVar6;
}

Assistant:

static bool validateSortedAtomicRampAdditionValueChain (const std::vector<deUint32>& valueChain, deUint32 sumValue, int& invalidOperationNdx, deUint32& errorDelta, deUint32& errorExpected)
{
	std::vector<deUint32> chainDelta(valueChain.size());

	for (int callNdx = 0; callNdx < (int)valueChain.size(); ++callNdx)
		chainDelta[callNdx] = ((callNdx + 1 == (int)valueChain.size()) ? (sumValue) : (valueChain[callNdx+1])) - valueChain[callNdx];

	// chainDelta contains now the actual additions applied to the value
	// check there exists an addition ramp form 1 to ...
	std::sort(chainDelta.begin(), chainDelta.end());

	for (int callNdx = 0; callNdx < (int)valueChain.size(); ++callNdx)
	{
		if ((int)chainDelta[callNdx] != callNdx+1)
		{
			invalidOperationNdx = callNdx;
			errorDelta = chainDelta[callNdx];
			errorExpected = callNdx+1;

			return false;
		}
	}

	return true;
}